

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_> *
__thiscall
libtorrent::aux::torrent::trackers
          (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           *__return_storage_ptr__,torrent *this)

{
  long lVar1;
  ushort uVar2;
  undefined8 uVar3;
  ushort uVar4;
  ulong uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  long lVar9;
  node_ptr plVar10;
  long lVar11;
  string *psVar12;
  node_ptr plVar13;
  node_ptr plVar14;
  byte local_6a [2];
  vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
  *local_68;
  node_ptr local_60;
  long local_58;
  node_ptr local_50;
  vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
  *local_48;
  node_ptr local_40;
  long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::reserve(__return_storage_ptr__,
            (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.super_size_traits.size_);
  plVar13 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node;
  plVar14 = plVar13;
  local_68 = (vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
              *)__return_storage_ptr__;
  local_60 = plVar13;
  while (plVar14 = ((node *)&plVar14->next_)->next_, plVar14 != plVar13) {
    ::std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
    ::emplace_back<std::__cxx11::string_const&>
              ((vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
                *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar14 + 1));
    lVar1 = *(long *)((long)__return_storage_ptr__ + 8);
    *(byte *)(lVar1 + -6) =
         *(byte *)(lVar1 + -6) & 0xf0 | *(undefined1 *)((long)&plVar14[6].prev_ + 6) & 0xf;
    ::std::__cxx11::string::_M_assign((string *)(lVar1 + -0x40));
    *(byte *)(lVar1 + -6) =
         *(byte *)(lVar1 + -6) & 0xef | *(undefined1 *)((long)&plVar14[6].prev_ + 6) & 0x10;
    *(undefined1 *)(lVar1 + -8) = *(undefined1 *)((long)&plVar14[6].prev_ + 4);
    *(undefined1 *)(lVar1 + -7) = *(undefined1 *)((long)&plVar14[6].prev_ + 5);
    local_48 = (vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
                *)(lVar1 + -0x20);
    ::std::
    vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
    ::reserve(local_48,((long)plVar14[5].prev_ - (long)plVar14[5].next_) / 200);
    local_40 = plVar14[5].prev_;
    local_58 = lVar1;
    local_50 = plVar14;
    for (plVar10 = plVar14[5].next_; lVar1 = local_58, plVar14 = local_50, plVar10 != local_40;
        plVar10 = (node_ptr)&plVar10[0xc].prev_) {
      ::std::
      vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
      ::emplace_back<>(local_48);
      local_38 = *(long *)(lVar1 + -0x18);
      plVar13 = plVar10->next_;
      plVar14 = plVar10->prev_;
      uVar3 = *(undefined8 *)((long)&plVar10[1].next_ + 4);
      *(undefined8 *)(local_38 + -0xec) = *(undefined8 *)((long)&plVar10->prev_ + 4);
      *(undefined8 *)(local_38 + -0xe4) = uVar3;
      *(node_ptr *)(local_38 + -0xf8) = plVar13;
      *(node_ptr *)(local_38 + -0xf0) = plVar14;
      *(byte *)(local_38 + -2) = *(byte *)&plVar10[0xb].next_ & 1;
      local_6a[0] = 0;
      local_6a[1] = 1;
      lVar1 = local_38 + -0xd8;
      for (lVar9 = 0; lVar11 = local_38, lVar9 != 2; lVar9 = lVar9 + 1) {
        uVar5 = (ulong)local_6a[lVar9];
        lVar11 = uVar5 * 0x48;
        psVar12 = (string *)(lVar11 + lVar1);
        ::std::__cxx11::string::_M_assign(psVar12);
        uVar3 = *(undefined8 *)((long)plVar10 + (uVar5 * 9 + 9) * 8);
        *(undefined8 *)(psVar12 + 0x20) = *(undefined8 *)((long)plVar10 + (uVar5 * 9 + 8) * 8);
        *(undefined8 *)(psVar12 + 0x28) = uVar3;
        *(undefined4 *)(psVar12 + 0x30) = *(undefined4 *)((long)plVar10 + (uVar5 * 9 + 10) * 8);
        *(undefined4 *)(psVar12 + 0x34) = *(undefined4 *)((long)plVar10 + lVar11 + 0x54);
        *(undefined8 *)(psVar12 + 0x38) = *(undefined8 *)((long)plVar10 + (uVar5 * 9 + 0xb) * 8);
        *(undefined4 *)(psVar12 + 0x40) = *(undefined4 *)((long)plVar10 + (uVar5 * 9 + 0xc) * 8);
        uVar6 = *(ushort *)((long)plVar10 + lVar11 + 100) & 0x7f;
        uVar2 = (ushort)*(undefined4 *)(psVar12 + 0x44);
        *(ushort *)(psVar12 + 0x44) = uVar2 & 0xff80 | uVar6;
        uVar4 = *(ushort *)((long)plVar10 + lVar11 + 100) & 0x80;
        *(ushort *)(psVar12 + 0x44) = uVar2 & 0xff00 | uVar6 | uVar4;
        uVar7 = *(ushort *)((long)plVar10 + lVar11 + 100) & 0x100;
        *(ushort *)(psVar12 + 0x44) = uVar2 & 0xfe00 | uVar6 | uVar4 | uVar7;
        uVar8 = *(ushort *)((long)plVar10 + lVar11 + 100) & 0x200;
        *(ushort *)(psVar12 + 0x44) = uVar2 & 0xfc00 | uVar6 | uVar4 | uVar7 | uVar8;
        *(ushort *)(psVar12 + 0x44) =
             uVar2 & 0xf800 | uVar6 | uVar4 | uVar7 | uVar8 |
             *(ushort *)((long)plVar10 + lVar11 + 100) & 0x400;
      }
      ::std::__cxx11::string::_M_assign((string *)(local_38 + -0x40));
      *(node_ptr *)(lVar11 + -0x10) = plVar10[5].prev_;
      *(undefined4 *)(lVar11 + -8) = *(undefined4 *)&plVar10[6].next_;
      uVar6 = *(ushort *)((long)&plVar10[6].next_ + 4) & 0x200;
      uVar2 = (ushort)*(undefined4 *)(lVar11 + -4);
      *(ushort *)(lVar11 + -4) = uVar2 & 0xfdff | uVar6;
      plVar13 = plVar10[4].prev_;
      *(node_ptr *)(lVar11 + -0x20) = plVar10[4].next_;
      *(node_ptr *)(lVar11 + -0x18) = plVar13;
      uVar4 = *(ushort *)((long)&plVar10[6].next_ + 4) & 0x7f;
      *(ushort *)(lVar11 + -4) = uVar2 & 0xfd80 | uVar6 | uVar4;
      *(undefined4 *)(lVar11 + -0x48) = *(undefined4 *)&plVar10[5].next_;
      *(undefined4 *)(lVar11 + -0x44) = *(undefined4 *)((long)&plVar10[5].next_ + 4);
      *(ushort *)(lVar11 + -4) =
           uVar2 & 0xfd00 | uVar6 | uVar4 | *(ushort *)((long)&plVar10[6].next_ + 4) & 0x80;
      __return_storage_ptr__ =
           (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            *)local_68;
      plVar13 = local_60;
    }
  }
  return (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *)(vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
             *)__return_storage_ptr__;
}

Assistant:

std::vector<lt::announce_entry> torrent::trackers() const
	{
		std::vector<lt::announce_entry> ret;
		ret.reserve(m_trackers.size());
		for (auto const& t : m_trackers)
		{
			ret.emplace_back(t.url);
			auto& tr = ret.back();
			tr.source = t.source;
			tr.trackerid = t.trackerid;
			tr.verified = t.verified;
			tr.tier = t.tier;
			tr.fail_limit = t.fail_limit;
			tr.endpoints.reserve(t.endpoints.size());
			for (auto const& ep : t.endpoints)
			{
				tr.endpoints.emplace_back();
				auto& aep = tr.endpoints.back();
				aep.local_endpoint = ep.local_endpoint;
				aep.enabled = ep.enabled;

				for (protocol_version v : {protocol_version::V1, protocol_version::V2})
				{
					aep.info_hashes[v].message = ep.info_hashes[v].message;
					aep.info_hashes[v].last_error = ep.info_hashes[v].last_error;
					aep.info_hashes[v].next_announce = ep.info_hashes[v].next_announce;
					aep.info_hashes[v].min_announce = ep.info_hashes[v].min_announce;
					aep.info_hashes[v].scrape_incomplete = ep.info_hashes[v].scrape_incomplete;
					aep.info_hashes[v].scrape_complete = ep.info_hashes[v].scrape_complete;
					aep.info_hashes[v].scrape_downloaded = ep.info_hashes[v].scrape_downloaded;
					aep.info_hashes[v].fails = ep.info_hashes[v].fails;
					aep.info_hashes[v].updating = ep.info_hashes[v].updating;
					aep.info_hashes[v].start_sent = ep.info_hashes[v].start_sent;
					aep.info_hashes[v].complete_sent = ep.info_hashes[v].complete_sent;
					aep.info_hashes[v].triggered_manually = ep.info_hashes[v].triggered_manually;
#if TORRENT_ABI_VERSION == 1
					tr.complete_sent |= ep.info_hashes[v].complete_sent;
#endif
				}
#if TORRENT_ABI_VERSION <= 2
#include "libtorrent/aux_/disable_warnings_push.hpp"
				aep.message = aep.info_hashes[protocol_version::V1].message;
				aep.scrape_incomplete = ep.info_hashes[protocol_version::V1].scrape_incomplete;
				aep.scrape_complete = ep.info_hashes[protocol_version::V1].scrape_complete;
				aep.scrape_downloaded = ep.info_hashes[protocol_version::V1].scrape_downloaded;
				aep.complete_sent = ep.info_hashes[protocol_version::V1].complete_sent;
				aep.last_error = ep.info_hashes[protocol_version::V1].last_error;
				aep.fails = ep.info_hashes[protocol_version::V1].fails;
				aep.next_announce = ep.info_hashes[protocol_version::V1].next_announce;
				aep.min_announce = ep.info_hashes[protocol_version::V1].min_announce;
				aep.updating = ep.info_hashes[protocol_version::V1].updating;
#include "libtorrent/aux_/disable_warnings_pop.hpp"
#endif
			}
		}
		return ret;
	}